

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unity.c
# Opt level: O2

void UnityAssertEqualNumber
               (UNITY_INT expected,UNITY_INT actual,char *msg,UNITY_UINT lineNumber,
               UNITY_DISPLAY_STYLE_T style)

{
  if (((expected != actual) && (Unity.CurrentTestFailed == 0)) && (Unity.CurrentTestIgnored == 0)) {
    UnityTestResultsFailBegin(lineNumber);
    UnityPrint(" Expected ");
    UnityPrintNumberByStyle(expected,style);
    UnityPrint(" Was ");
    UnityPrintNumberByStyle(actual,style);
    UnityAddMsgIfSpecified(msg);
    Unity.CurrentTestFailed = 1;
    longjmp((__jmp_buf_tag *)Unity.AbortFrame,1);
  }
  return;
}

Assistant:

void UnityAssertEqualNumber(const UNITY_INT expected,
                            const UNITY_INT actual,
                            const char* msg,
                            const UNITY_LINE_TYPE lineNumber,
                            const UNITY_DISPLAY_STYLE_T style)
{
    RETURN_IF_FAIL_OR_IGNORE;

    if (expected != actual)
    {
        UnityTestResultsFailBegin(lineNumber);
        UnityPrint(UnityStrExpected);
        UnityPrintNumberByStyle(expected, style);
        UnityPrint(UnityStrWas);
        UnityPrintNumberByStyle(actual, style);
        UnityAddMsgIfSpecified(msg);
        UNITY_FAIL_AND_BAIL;
    }
}